

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(TokenKind kind)

{
  TokenKind in_DI;
  bool local_1;
  
  if (((in_DI == CloseBrace) || (in_DI == CloseBracket)) || (in_DI == CloseParenthesis)) {
    local_1 = true;
  }
  else {
    local_1 = isEndKeyword(in_DI);
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isCloseDelimOrKeyword(TokenKind kind) {
    switch (kind) {
        case TokenKind::CloseBrace:
        case TokenKind::CloseBracket:
        case TokenKind::CloseParenthesis:
            return true;
        default:
            return isEndKeyword(kind);
    }
}